

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::ExternUdpDeclSyntax::ExternUdpDeclSyntax
          (ExternUdpDeclSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token externKeyword,SyntaxList<slang::syntax::AttributeInstanceSyntax> *actualAttributes,
          Token primitive,Token name,UdpPortListSyntax *portList)

{
  pointer ppAVar1;
  size_t sVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = externKeyword._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ExternUdpDecl,attributes);
  (this->externKeyword).kind = (short)uVar5;
  (this->externKeyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->externKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->externKeyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->externKeyword).info = externKeyword.info;
  uVar4 = *(undefined4 *)&(actualAttributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (actualAttributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (actualAttributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (actualAttributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005a2c10;
  (this->actualAttributes).super_SyntaxListBase.childCount =
       (actualAttributes->super_SyntaxListBase).childCount;
  sVar2 = (actualAttributes->
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (actualAttributes->
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (this->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005a2b60;
  (this->primitive).kind = primitive.kind;
  (this->primitive).field_0x2 = primitive._2_1_;
  (this->primitive).numFlags = (NumericTokenFlags)primitive.numFlags.raw;
  (this->primitive).rawLen = primitive.rawLen;
  (this->primitive).info = primitive.info;
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  (this->name).info = name.info;
  (this->portList).ptr = portList;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  ppAVar1 = (this->actualAttributes).
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  sVar2 = (this->actualAttributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  for (lVar6 = 0; sVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
    *(ExternUdpDeclSyntax **)(*(long *)((long)ppAVar1 + lVar6) + 8) = this;
  }
  (portList->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

ExternUdpDeclSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token externKeyword, const SyntaxList<AttributeInstanceSyntax>& actualAttributes, Token primitive, Token name, UdpPortListSyntax& portList) :
        MemberSyntax(SyntaxKind::ExternUdpDecl, attributes), externKeyword(externKeyword), actualAttributes(actualAttributes), primitive(primitive), name(name), portList(&portList) {
        this->actualAttributes.parent = this;
        for (auto child : this->actualAttributes)
            child->parent = this;
        this->portList->parent = this;
    }